

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

void do_mapping(void)

{
  byte bVar1;
  int local_10;
  int uw;
  int zy;
  int zx;
  
  bVar1 = (byte)u._1052_1_ >> 1 & 1;
  u._1052_1_ = u._1052_1_ & 0xfd;
  for (uw = 1; uw < 0x50; uw = uw + 1) {
    for (local_10 = 0; local_10 < 0x15; local_10 = local_10 + 1) {
      show_map_spot(uw,local_10);
    }
  }
  exercise(2,'\x01');
  u._1052_1_ = u._1052_1_ & 0xfd | bVar1 << 1;
  if (((*(uint *)&(level->flags).field_0x8 >> 0xe & 1) == 0) || (bVar1 != 0)) {
    flush_screen();
    (*windowprocs.win_pause)(P_MAP);
    doredraw();
  }
  return;
}

Assistant:

void do_mapping(void)
{
    int zx, zy;
    int uw = u.uinwater;

    u.uinwater = 0;
    for (zx = 1; zx < COLNO; zx++)
	for (zy = 0; zy < ROWNO; zy++)
	    show_map_spot(zx, zy);
    exercise(A_WIS, TRUE);
    u.uinwater = uw;
    if (!level->flags.hero_memory || Underwater) {
	flush_screen();			/* flush temp screen */
	win_pause_output(P_MAP);	/* wait */
	doredraw();
    }
}